

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O1

void __thiscall arm::Arith3Inst::display(Arith3Inst *this,ostream *o)

{
  display_op((this->super_Inst).op,o);
  display_cond((this->super_Inst).cond,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," ",1);
  display_reg_name(o,this->rd);
  std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
  display_reg_name(o,this->r1);
  std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
  (**(this->r2).super_Displayable._vptr_Displayable)(&this->r2,o);
  return;
}

Assistant:

void Arith3Inst::display(std::ostream &o) const {
  display_op(op, o);
  display_cond(cond, o);
  o << " ";
  display_reg_name(o, rd);
  o << ", ";
  display_reg_name(o, r1);
  o << ", " << r2;
}